

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::LayoutBindingBaseCase::maxArraySize(LayoutBindingBaseCase *this)

{
  eStageType eVar1;
  int iVar2;
  undefined4 extraout_var;
  Functions *pFVar3;
  GLint local_14;
  LayoutBindingBaseCase *pLStack_10;
  int units;
  LayoutBindingBaseCase *this_local;
  
  local_14 = 0;
  pLStack_10 = this;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 8) == 2) {
    eVar1 = (this->m_stage).type;
    if (eVar1 == VertexShader) {
      pFVar3 = gl(this);
      (*pFVar3->getIntegerv)(0x90ca,&local_14);
    }
    else if (eVar1 == FragmentShader) {
      pFVar3 = gl(this);
      (*pFVar3->getIntegerv)(0x90ce,&local_14);
    }
  }
  else {
    eVar1 = (this->m_stage).type;
    if (eVar1 == VertexShader) {
      pFVar3 = gl(this);
      (*pFVar3->getIntegerv)(0x8b4c,&local_14);
    }
    else if (eVar1 == FragmentShader) {
      pFVar3 = gl(this);
      (*pFVar3->getIntegerv)(0x8872,&local_14);
    }
  }
  return local_14;
}

Assistant:

virtual int maxArraySize()
	{
		int units = 0;

		if (getTestParameters().surface_type == Image)
		{
			switch (m_stage.type)
			{
			case VertexShader:
				gl().getIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &units);
				break;
			case FragmentShader:
				gl().getIntegerv(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, &units);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
		else
		{
			switch (m_stage.type)
			{
			case VertexShader:
				gl().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &units);
				break;
			case FragmentShader:
				gl().getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &units);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}

		return units;
	}